

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sph.cpp
# Opt level: O2

void sph_solve<CRC32x8>(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *keywords)

{
  uchar uVar1;
  pointer puVar2;
  uint c;
  uint uVar3;
  pointer pbVar4;
  long lVar5;
  result_type rVar6;
  ulong uVar7;
  KHType KVar8;
  pointer pbVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  vector<unsigned_char,_std::allocator<unsigned_char>_> srcTable;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  permutedKeywords;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  CRC32x8 hasher;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mixtable;
  uniform_int_distribution<unsigned_long> udist;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  CRC32x8 local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  undefined8 local_40;
  pointer local_38;
  
  local_60.name = "CRC32x8";
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_90,
           (long)(keywords->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(keywords->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_78);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
             (long)(keywords->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(keywords->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_58);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,(long)mixersize);
  if (-1 < (long)permutesize) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&local_90,(long)permutesize);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,(long)permutesize);
  }
  pbVar9 = (keywords->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (keywords->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar10 = (ulong)((long)pbVar4 - (long)pbVar9) >> 5;
  do {
    uVar7 = uVar10 & 0xffffffff;
    if ((ulong)((long)pbVar4 - (long)pbVar9 >> 4) <= uVar7) {
      puts("Failure!");
LAB_00102f15:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_90);
      return;
    }
    if (permutesize == -1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&local_90,uVar7);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,uVar7);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,0x100,
               (allocator_type *)&local_40);
    for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
      local_a8._M_impl.super__Vector_impl_data._M_start[lVar5] = (uchar)lVar5;
    }
    local_38 = local_a8._M_impl.super__Vector_impl_data._M_finish +
               ~(ulong)local_a8._M_impl.super__Vector_impl_data._M_start;
    local_40 = 0;
    uVar11 = 0;
    bVar13 = true;
    while( true ) {
      if (((uint)maxiter <= uVar11) || (!bVar13)) break;
      uVar3 = 0;
      while( true ) {
        puVar2 = local_a8._M_impl.super__Vector_impl_data._M_start;
        uVar7 = (ulong)uVar3;
        if ((ulong)((long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a8._M_impl.super__Vector_impl_data._M_start) <= uVar7) break;
        rVar6 = std::uniform_int_distribution<unsigned_long>::operator()
                          ((uniform_int_distribution<unsigned_long> *)&local_40,&rng);
        uVar1 = puVar2[uVar7];
        puVar2[uVar7] = local_a8._M_impl.super__Vector_impl_data._M_start[rVar6];
        local_a8._M_impl.super__Vector_impl_data._M_start[rVar6] = uVar1;
        uVar3 = uVar3 + 1;
      }
      uVar3 = 0;
      while( true ) {
        uVar7 = (ulong)uVar3;
        if ((ulong)((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_58._M_impl.super__Vector_impl_data._M_start) <= uVar7) break;
        local_58._M_impl.super__Vector_impl_data._M_start[uVar7] =
             local_a8._M_impl.super__Vector_impl_data._M_start[uVar7];
        uVar3 = uVar3 + 1;
      }
      uVar3 = 0;
      while( true ) {
        uVar7 = (ulong)uVar3;
        if ((ulong)((long)local_90.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_90.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar7) break;
        local_78._M_impl.super__Vector_impl_data._M_start[uVar7] = 0;
        local_90.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_string_length = 0;
        *local_90.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p = '\0';
        uVar3 = uVar3 + 1;
      }
      uVar3 = 0;
      while( true ) {
        uVar12 = (ulong)uVar3;
        pbVar9 = (keywords->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar7 = (long)(keywords->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5;
        if (uVar7 <= uVar12) break;
        KVar8 = CRC32x8::operator()(&local_60,pbVar9 + uVar12,
                                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &local_58,
                                    (long)local_90.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_90.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar7 = (ulong)(uint)((int)((ulong)KVar8 & 0xff) << 5);
        if (*(long *)((long)&(local_90.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + uVar7)
            != 0) {
          uVar7 = (long)(keywords->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(keywords->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5;
          break;
        }
        local_78._M_impl.super__Vector_impl_data._M_start[(ulong)KVar8 & 0xff] = KVar8.hash;
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)&((local_90.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + uVar7))
        ;
        uVar3 = uVar3 + 1;
      }
      bVar13 = uVar7 != uVar12;
      uVar11 = uVar11 + 1;
    }
    if (!bVar13) {
      printf("%s solution for %lu keywords using a %lu keyword table (%u iterations)\n",
             local_60.name,
             (long)(keywords->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(keywords->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,
             (long)local_90.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_90.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
      sph_soln<CRC32x8>(keywords,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
                        &local_90,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
      goto LAB_00102f15;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
    uVar10 = (ulong)((int)uVar10 + 1);
    pbVar9 = (keywords->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (keywords->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

void sph_solve(vector<string> &keywords)
{
    T hasher;
    vector<string> permutedKeywords(keywords.size());
    vector<typename T::Hash> hashes(keywords.size());
    vector<typename T::Key> mixtable;
    uint keysize = 1 << (sizeof(typename T::Key) * 8);

    mixtable.resize(mixersize); // must be ^2 and <= keysize

    uint iterations = 0;

    if (permutesize > -1)
    {
        permutedKeywords.resize(permutesize);
        hashes.resize(permutesize);
    }

    for(uint i = keywords.size(); i < keywords.size() * 2; i++)
    {
        if (permutesize == -1)
        {
            // if there are collisions, try a progressively larger keyword table
            permutedKeywords.resize(i);
            hashes.resize(i);
        }
        vector<typename T::Key> srcTable(keysize );
        for(uint c = 0; c < keysize; c++ )
            srcTable[ c ] = c;

        std::uniform_int_distribution<rng_type::result_type> udist(0, srcTable.size() -1);

        // mixtable retry loop...
        bool collision = true; // default assumption
        iterations = 0;
        while((iterations < maxiter) && collision)
        {
            // permute the srcTable and build mixtable and clear the hash stats
            for( uint i = 0; i < srcTable.size(); i++ )
                std::swap(srcTable[i], srcTable[ udist(rng) ]);
            for( uint i = 0; i < mixtable.size(); i++ )
                mixtable[i] = srcTable[i];
            for( uint pk = 0; pk < permutedKeywords.size(); pk++ )
            { hashes[pk] = 0; permutedKeywords[pk].clear(); }

            // trial hash all keywords. check for collisions
            uint k = 0;
            for( k = 0; k < keywords.size(); k++ )
            {
                auto kh = hasher(keywords[k], mixtable, permutedKeywords.size());
                if( permutedKeywords[ kh.key ].length() > 0 )
                    break; // collision
                hashes[ kh.key ] = kh.hash;
                permutedKeywords[ kh.key ] = keywords[ k ];
            }
            if( k == keywords.size() )
                collision = false; // no collisions
            iterations++;
        }
        if (!collision)
        {
            printf("%s solution for %lu keywords using a %lu keyword table (%u iterations)\n", hasher.name, keywords.size(), permutedKeywords.size(), iterations);
            sph_soln<T>(keywords, mixtable, permutedKeywords, hashes);
            return;
        }
    }
    printf("Failure!\n");
}